

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O3

Read<signed_char> __thiscall
Omega_h::fan_reduce_tmpl<Omega_h::MaxFunctor<long>>
          (Omega_h *this,LOs *a2b,Read<signed_char> *b_data,Int width)

{
  int *piVar1;
  Alloc *pAVar2;
  void ***pppvVar3;
  int iVar4;
  ulong uVar5;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar6;
  size_t sVar7;
  Read<signed_char> RVar8;
  Write<signed_char> a_data;
  type f;
  Write<long> local_88;
  Write<long> local_78;
  type local_68;
  
  iVar4 = Read<int>::last(a2b);
  pAVar2 = (b_data->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    uVar5 = pAVar2->size;
  }
  else {
    uVar5 = (ulong)pAVar2 >> 3;
  }
  if (iVar4 * width == (int)(uVar5 >> 3)) {
    pAVar2 = (a2b->write_).shared_alloc_.alloc;
    if (((ulong)pAVar2 & 1) == 0) {
      sVar7 = pAVar2->size;
    }
    else {
      sVar7 = (ulong)pAVar2 >> 3;
    }
    pppvVar3 = (void ***)&local_68.a2b.write_.shared_alloc_.direct_ptr;
    local_68._0_8_ = pppvVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
    iVar4 = (int)(sVar7 >> 2) + -1;
    Write<long>::Write(&local_88,iVar4 * width,(string *)&local_68);
    if ((void ***)local_68._0_8_ != pppvVar3) {
      operator_delete((void *)local_68._0_8_,(long)local_68.a2b.write_.shared_alloc_.direct_ptr + 1)
      ;
    }
    local_68.width = width;
    local_68.a2b.write_.shared_alloc_.alloc = (a2b->write_).shared_alloc_.alloc;
    if (((ulong)local_68.a2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_68.a2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_68.a2b.write_.shared_alloc_.alloc =
             (Alloc *)((local_68.a2b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_68.a2b.write_.shared_alloc_.alloc)->use_count =
             (local_68.a2b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_68.a2b.write_.shared_alloc_.direct_ptr = (a2b->write_).shared_alloc_.direct_ptr;
    local_68.b_data.write_.shared_alloc_.alloc = (b_data->write_).shared_alloc_.alloc;
    if (((ulong)local_68.b_data.write_.shared_alloc_.alloc & 7) == 0 &&
        local_68.b_data.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_68.b_data.write_.shared_alloc_.alloc =
             (Alloc *)((local_68.b_data.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_68.b_data.write_.shared_alloc_.alloc)->use_count =
             (local_68.b_data.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_68.b_data.write_.shared_alloc_.direct_ptr = (b_data->write_).shared_alloc_.direct_ptr;
    local_68.a_data.shared_alloc_.alloc = local_88.shared_alloc_.alloc;
    if (((ulong)local_88.shared_alloc_.alloc & 7) == 0 &&
        local_88.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_68.a_data.shared_alloc_.alloc =
             (Alloc *)((local_88.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_88.shared_alloc_.alloc)->use_count = (local_88.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_68.a_data.shared_alloc_.direct_ptr = local_88.shared_alloc_.direct_ptr;
    parallel_for<Omega_h::fan_reduce_tmpl<Omega_h::MaxFunctor<long>>(Omega_h::Read<int>,Omega_h::Read<Omega_h::MaxFunctor<long>::input_type>,int)::_lambda(int)_1_>
              (iVar4,&local_68,"fan_reduce");
    local_78.shared_alloc_.alloc = local_88.shared_alloc_.alloc;
    local_78.shared_alloc_.direct_ptr = local_88.shared_alloc_.direct_ptr;
    if ((((ulong)local_88.shared_alloc_.alloc & 7) == 0 &&
         local_88.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      (local_88.shared_alloc_.alloc)->use_count = (local_88.shared_alloc_.alloc)->use_count + -1;
      local_78.shared_alloc_.alloc = (Alloc *)((local_88.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_88.shared_alloc_.alloc = (Alloc *)0x0;
    local_88.shared_alloc_.direct_ptr = (void *)0x0;
    Read<long>::Read((Read<signed_char> *)this,&local_78);
    pAVar2 = local_78.shared_alloc_.alloc;
    if (((ulong)local_78.shared_alloc_.alloc & 7) == 0 &&
        local_78.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_78.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_78.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    fan_reduce_tmpl<Omega_h::MaxFunctor<long>>(Omega_h::Read<int>,Omega_h::Read<Omega_h::MaxFunctor<long>::input_type>,int)
    ::{lambda(int)#1}::~Read((_lambda_int__1_ *)&local_68);
    pAVar2 = local_88.shared_alloc_.alloc;
    pvVar6 = extraout_RDX;
    if (((ulong)local_88.shared_alloc_.alloc & 7) == 0 &&
        local_88.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_88.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_88.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
        pvVar6 = extraout_RDX_00;
      }
    }
    RVar8.write_.shared_alloc_.direct_ptr = pvVar6;
    RVar8.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<signed_char>)RVar8.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a2b.last() * width == b_data.size()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
       ,0x127);
}

Assistant:

Read<typename Functor::input_type> fan_reduce_tmpl(
    LOs a2b, Read<typename Functor::input_type> b_data, Int width) {
  using T = typename Functor::input_type;
  using VT = typename Functor::value_type;
  OMEGA_H_CHECK(a2b.last() * width == b_data.size());
  auto na = a2b.size() - 1;
  Write<T> a_data(na * width);
  auto f = OMEGA_H_LAMBDA(LO a) {
    auto functor = Functor();
    for (Int j = 0; j < width; ++j) {
      VT res;
      functor.init(res);
      for (auto b = a2b[a]; b < a2b[a + 1]; ++b) {
        VT update = b_data[b * width + j];
        functor.join(res, update);
      }
      a_data[a * width + j] = static_cast<T>(res);
    }
  };
  parallel_for(na, f, "fan_reduce");
  return a_data;
}